

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.c
# Opt level: O2

_Bool upb_Message_IsEqual(upb_Message *msg1,upb_Message *msg2,upb_MiniTable *m,int options)

{
  long lVar1;
  upb_Array *arr1;
  upb_MessageValue uVar2;
  upb_MessageValue val1_00;
  undefined8 map;
  undefined8 map_00;
  _Bool _Var3;
  _Bool _Var4;
  upb_CType uVar5;
  upb_UnknownCompareResult uVar6;
  upb_MiniTable *puVar7;
  size_t sVar8;
  ulong uVar9;
  upb_Extension *puVar10;
  size_t sVar11;
  upb_MiniTableField *f;
  upb_MiniTableExtension *e;
  long *plVar12;
  ulong uVar13;
  uint *puVar15;
  upb_MessageValue val2_00;
  size_t local_d8;
  upb_MiniTable *local_d0;
  upb_MiniTableField *f1;
  upb_Array *local_b0;
  upb_MessageValue local_a8;
  upb_MessageValue val1;
  size_t local_88;
  upb_MiniTableField *f2;
  size_t iter2;
  size_t iter1;
  size_t local_68;
  upb_MessageValue val2;
  upb_MessageValue val1_1;
  upb_MessageValue key;
  ulong uVar14;
  
  _Var3 = true;
  if (msg1 != msg2) {
    iter1 = 0xffffffffffffffff;
    iter2 = 0xffffffffffffffff;
switchD_002a76f5_caseD_3:
    do {
      _Var3 = _upb_Message_NextBaseField_dont_copy_me__upb_internal_use_only
                        (msg1,m,&f1,&val1,&iter1);
      _Var4 = _upb_Message_NextBaseField_dont_copy_me__upb_internal_use_only
                        (msg2,m,&f2,&local_a8,&iter2);
      if ((!_Var3) || (!_Var4)) {
        if (_Var3 == _Var4) {
          uVar13 = 0;
          local_d8 = 0;
          goto switchD_002a7962_caseD_3;
        }
        break;
      }
      if (f1 != f2) break;
      puVar7 = upb_MiniTable_SubMessage(m,f1);
      uVar5 = upb_MiniTableField_CType(f1);
      map_00 = val1.double_val;
      map = local_a8.double_val;
      switch(f1->mode_dont_copy_me__upb_internal_use_only & 3) {
      case 0:
        if (val1.int64_val != local_a8.int64_val) {
          if (val1.int64_val == 0) {
            sVar11 = 0;
          }
          else {
            sVar11 = upb_Map_Size(val1.map_val);
          }
          if ((upb_Map *)map == (upb_Map *)0x0) {
            sVar8 = 0;
          }
          else {
            sVar8 = upb_Map_Size((upb_Map *)map);
          }
          if (sVar11 != sVar8) goto LAB_002a79dd;
          if (puVar7->field_count_dont_copy_me__upb_internal_use_only != 2) {
            __assert_fail("upb_MiniTable_FieldCount(m) == 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/message.h"
                          ,0xa5,
                          "const struct upb_MiniTableField *upb_MiniTable_MapValue(const struct upb_MiniTable *)"
                         );
          }
          if (puVar7->fields_dont_copy_me__upb_internal_use_only[1].
              number_dont_copy_me__upb_internal_use_only != 2) {
            __assert_fail("upb_MiniTableField_Number(f) == 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/message.h"
                          ,0xa7,
                          "const struct upb_MiniTableField *upb_MiniTable_MapValue(const struct upb_MiniTable *)"
                         );
          }
          f = puVar7->fields_dont_copy_me__upb_internal_use_only + 1;
          puVar7 = upb_MiniTable_SubMessage(puVar7,f);
          uVar5 = upb_MiniTableField_CType(f);
          local_68 = 0xffffffffffffffff;
          while (_Var3 = upb_Map_Next((upb_Map *)map_00,&key,&val1_1,&local_68), _Var3) {
            _Var3 = upb_Map_Get((upb_Map *)map,key,&val2);
            if ((!_Var3) ||
               (_Var3 = upb_MessageValue_IsEqual(val1_1,val2,uVar5,puVar7,options), !_Var3))
            goto LAB_002a79dd;
          }
        }
        goto switchD_002a76f5_caseD_3;
      case 1:
        _Var3 = _upb_Array_IsEqual(val1.array_val,local_a8.array_val,uVar5,puVar7,options);
        break;
      case 2:
        val1_00.str_val.size = val1.str_val.size;
        val1_00.double_val = val1.double_val;
        uVar2.str_val.size = local_a8.str_val.size;
        uVar2.double_val = local_a8.double_val;
        _Var3 = upb_MessageValue_IsEqual(val1_00,uVar2,uVar5,puVar7,options);
        break;
      case 3:
        goto switchD_002a76f5_caseD_3;
      }
    } while (_Var3 != false);
LAB_002a79dd:
    _Var3 = false;
  }
  return _Var3;
switchD_002a7962_caseD_3:
  puVar15 = (uint *)((msg1->field_0).internal_opaque & 0xfffffffffffffffe);
  uVar14 = uVar13;
  if (puVar15 == (uint *)0x0) {
LAB_002a79ab:
    sVar11 = upb_Message_ExtensionCount(msg2);
    if (local_d8 == sVar11) {
      if ((options & 1U) == 0) {
        return true;
      }
      uVar6 = _upb_Message_UnknownFieldsAreEqual_dont_copy_me__upb_internal_use_only(msg1,msg2,100);
      return uVar6 == kUpb_UnknownCompareResult_Equal;
    }
    goto LAB_002a79dd;
  }
LAB_002a7877:
  do {
    do {
      uVar13 = uVar14 + 1;
      if (*puVar15 <= uVar14) goto LAB_002a79ab;
      uVar14 = uVar13;
    } while ((*(ulong *)(puVar15 + uVar13 * 2) & 1) == 0);
    plVar12 = (long *)(*(ulong *)(puVar15 + uVar13 * 2) & 0xfffffffffffffffc);
    e = (upb_MiniTableExtension *)*plVar12;
    switch((e->field_dont_copy_me__upb_internal_use_only).mode_dont_copy_me__upb_internal_use_only &
           3) {
    case 0:
      lVar1 = plVar12[1];
      if (*(char *)(lVar1 + 3) == '\x01') {
        uVar9 = (ulong)*(uint *)(lVar1 + 0x10);
      }
      else {
        uVar9 = upb_inttable_count((upb_inttable *)(lVar1 + 8));
      }
      if (uVar9 != 0) {
        e = (upb_MiniTableExtension *)*plVar12;
        goto switchD_002a78aa_caseD_2;
      }
      goto LAB_002a7877;
    case 2:
      goto switchD_002a78aa_caseD_2;
    case 3:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/extension.h"
                    ,0x3f,
                    "_Bool _upb_Extension_IsEmpty_dont_copy_me__upb_internal_use_only(const upb_Extension *)"
                   );
    }
  } while (*(long *)(plVar12[1] + 8) == 0);
switchD_002a78aa_caseD_2:
  arr1 = (upb_Array *)((upb_StringView *)(plVar12 + 1))->data;
  uVar2.str_val = *(upb_StringView *)(plVar12 + 1);
  puVar10 = _upb_Message_Getext_dont_copy_me__upb_internal_use_only(msg2,e);
  if (puVar10 == (upb_Extension *)0x0) goto LAB_002a79dd;
  local_b0 = (puVar10->data).array_val;
  local_88 = (puVar10->data).str_val.size;
  if ((((e->field_dont_copy_me__upb_internal_use_only).
        descriptortype_dont_copy_me__upb_internal_use_only & 0xfe) == 10) &&
     (uVar5 = upb_MiniTableField_CType(&e->field_dont_copy_me__upb_internal_use_only),
     uVar5 == kUpb_CType_Message)) {
    local_d0 = (e->sub_dont_copy_me__upb_internal_use_only).
               submsg_dont_copy_me__upb_internal_use_only;
  }
  else {
    local_d0 = (upb_MiniTable *)0x0;
  }
  local_d8 = local_d8 + 1;
  uVar5 = upb_MiniTableField_CType(&e->field_dont_copy_me__upb_internal_use_only);
  switch((e->field_dont_copy_me__upb_internal_use_only).mode_dont_copy_me__upb_internal_use_only & 3
        ) {
  case 0:
    goto switchD_002a7962_caseD_0;
  case 1:
    _Var3 = _upb_Array_IsEqual(arr1,local_b0,uVar5,local_d0,options);
    break;
  case 2:
    val2_00.str_val.size = local_88;
    val2_00.array_val = local_b0;
    _Var3 = upb_MessageValue_IsEqual(uVar2,val2_00,uVar5,local_d0,options);
    break;
  case 3:
    goto switchD_002a7962_caseD_3;
  }
  if (_Var3 == false) {
    return false;
  }
  goto switchD_002a7962_caseD_3;
switchD_002a7962_caseD_0:
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/compare.c"
                ,0xa2,
                "_Bool _upb_Message_ExtensionsAreEqual(const upb_Message *, const upb_Message *, const upb_MiniTable *, int)"
               );
}

Assistant:

bool upb_Message_IsEqual(const upb_Message* msg1, const upb_Message* msg2,
                         const upb_MiniTable* m, int options) {
  if (UPB_UNLIKELY(msg1 == msg2)) return true;

  if (!_upb_Message_BaseFieldsAreEqual(msg1, msg2, m, options)) return false;
  if (!_upb_Message_ExtensionsAreEqual(msg1, msg2, m, options)) return false;

  if (!(options & kUpb_CompareOption_IncludeUnknownFields)) return true;

  // The wire encoder enforces a maximum depth of 100 so we match that here.
  return UPB_PRIVATE(_upb_Message_UnknownFieldsAreEqual)(msg1, msg2, 100) ==
         kUpb_UnknownCompareResult_Equal;
}